

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

TxSize wallet::CalculateMaximumSignedTxSize
                 (CTransaction *tx,CWallet *wallet,CCoinControl *coin_control)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  const_iterator wallet_00;
  const_iterator coin_control_00;
  reference pCVar4;
  size_type sVar5;
  long in_RDX;
  vector<CTxOut,_std::allocator<CTxOut>_> *in_RSI;
  CTransaction *in_RDI;
  long in_FS_OFFSET;
  TxSize TVar6;
  optional<CTxOut> *txout;
  CTxIn *input;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  const_iterator mi;
  const_iterator __end1;
  const_iterator __begin1;
  vector<CTxOut,_std::allocator<CTxOut>_> txouts;
  __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffee8;
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  *in_stack_fffffffffffffef0;
  vector<CTxOut,_std::allocator<CTxOut>_> *in_stack_fffffffffffffef8;
  CTxOut *in_stack_ffffffffffffff00;
  CCoinControl *in_stack_ffffffffffffff08;
  int64_t local_80;
  int64_t local_78;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffee8);
  wallet_00 = std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                        ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffef0);
  coin_control_00 =
       std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                 ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffef0);
  do {
    bVar3 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                      ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)in_stack_fffffffffffffef8,
                       (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)in_stack_fffffffffffffef0);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      TVar6 = CalculateMaximumSignedTxSize
                        (in_RDI,(CWallet *)wallet_00._M_current,in_RSI,
                         (CCoinControl *)coin_control_00._M_current);
LAB_016c1d3f:
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(in_stack_fffffffffffffef8);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return TVar6;
    }
    pCVar4 = __gnu_cxx::
             __normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
             operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)in_stack_fffffffffffffee8);
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_fffffffffffffee8);
    std::
    unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
    ::find(in_stack_fffffffffffffef0,(key_type *)in_stack_fffffffffffffee8);
    std::
    unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
    ::end(in_stack_fffffffffffffef0);
    bVar3 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                       in_stack_fffffffffffffef8,
                       (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                       in_stack_fffffffffffffef0);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      if (in_RDX == 0) {
        TVar6.weight = -1;
        TVar6.vsize = -1;
        goto LAB_016c1d3f;
      }
      CCoinControl::GetExternalOutput
                (in_stack_ffffffffffffff08,(COutPoint *)in_stack_ffffffffffffff00);
      bVar3 = std::optional::operator_cast_to_bool((optional<CTxOut> *)in_stack_fffffffffffffee8);
      if (bVar3) {
        std::optional<CTxOut>::operator*((optional<CTxOut> *)in_stack_fffffffffffffee8);
        std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<CTxOut_const&>
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff08,
                   in_stack_ffffffffffffff00);
      }
      else {
        local_80 = -1;
        local_78 = -1;
      }
      TVar6.weight = local_78;
      TVar6.vsize = local_80;
      std::optional<CTxOut>::~optional((optional<CTxOut> *)in_stack_fffffffffffffee8);
      if (!bVar3) goto LAB_016c1d3f;
    }
    else {
      uVar1 = (pCVar4->prevout).n;
      std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>
      ::operator->((_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *
                   )in_stack_fffffffffffffee8);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->(in_stack_fffffffffffffee8);
      sVar5 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                        ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffee8);
      if (sVar5 <= uVar1) {
        __assert_fail("input.prevout.n < mi->second.tx->vout.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/spend.cpp"
                      ,0xae,
                      "TxSize wallet::CalculateMaximumSignedTxSize(const CTransaction &, const CWallet *, const CCoinControl *)"
                     );
      }
      std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>
      ::operator->((_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *
                   )in_stack_fffffffffffffee8);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->(in_stack_fffffffffffffee8);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::at
                (in_stack_fffffffffffffef8,(size_type)in_stack_fffffffffffffef0);
      std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<CTxOut_const&>
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff00);
    }
    __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
    operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
               in_stack_fffffffffffffee8);
  } while( true );
}

Assistant:

TxSize CalculateMaximumSignedTxSize(const CTransaction &tx, const CWallet *wallet, const CCoinControl* coin_control)
{
    std::vector<CTxOut> txouts;
    // Look up the inputs. The inputs are either in the wallet, or in coin_control.
    for (const CTxIn& input : tx.vin) {
        const auto mi = wallet->mapWallet.find(input.prevout.hash);
        // Can not estimate size without knowing the input details
        if (mi != wallet->mapWallet.end()) {
            assert(input.prevout.n < mi->second.tx->vout.size());
            txouts.emplace_back(mi->second.tx->vout.at(input.prevout.n));
        } else if (coin_control) {
            const auto& txout{coin_control->GetExternalOutput(input.prevout)};
            if (!txout) return TxSize{-1, -1};
            txouts.emplace_back(*txout);
        } else {
            return TxSize{-1, -1};
        }
    }
    return CalculateMaximumSignedTxSize(tx, wallet, txouts, coin_control);
}